

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void Assimp::IFC::ConvertTransformOperator(IfcMatrix4 *out,IfcCartesianTransformationOperator *op)

{
  IfcCartesianPoint *in;
  Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *pLVar1;
  IfcDirection *pIVar2;
  IfcCartesianTransformationOperator3D *pIVar3;
  IfcCartesianTransformationOperator3DnonUniform *pIVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  aiMatrix4x4t<double> *paVar8;
  aiMatrix4x4t<double> *paVar9;
  byte bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  IfcVector3 local_238;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  IfcVector3 local_200;
  IfcVector3 loc;
  IfcVector3 local_1c8;
  aiMatrix4x4t<double> temp;
  aiMatrix4x4t<double> temp_1;
  aiMatrix4x4t<double> local_a8;
  
  bVar10 = 0;
  loc.x = 0.0;
  loc.y = 0.0;
  loc.z = 0.0;
  in = STEP::Lazy::operator_cast_to_IfcCartesianPoint_((Lazy *)&op->LocalOrigin);
  ConvertCartesianPoint(&loc,in);
  local_200.x = 1.0;
  local_200.y = 0.0;
  local_200.z = 0.0;
  local_238.x._0_4_ = 0;
  local_238.x._4_4_ = 0;
  local_238.y._0_4_ = 0;
  local_238.y._4_4_ = 0x3ff00000;
  local_238.z = 0.0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_1c8.z = 1.0;
  if (op->field_0x38 == '\x01') {
    pLVar1 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                        &(op->super_IfcGeometricRepresentationItem).field_0x30);
    pIVar2 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar1);
    ConvertDirection(&local_200,pIVar2);
  }
  if ((op->Axis2).have == true) {
    pLVar1 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       (&op->Axis2);
    pIVar2 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar1);
    ConvertDirection(&local_238,pIVar2);
  }
  pIVar3 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D>
                     ((Object *)
                      ((long)&(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                              .
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  uVar14 = 0x3ff00000;
  if (pIVar3 == (IfcCartesianTransformationOperator3D *)0x0) {
    dVar15 = 0.0;
  }
  else {
    dVar15 = 0.0;
    if (pIVar3->field_0x80 == '\x01') {
      pLVar1 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                         ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                          &(pIVar3->super_IfcCartesianTransformationOperator).field_0x78);
      pIVar2 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar1);
      ConvertDirection(&local_1c8,pIVar2);
      uVar11 = SUB84(local_1c8.y,0);
      uVar12 = (undefined4)((ulong)local_1c8.y >> 0x20);
      uVar13 = SUB84(local_1c8.z,0);
      uVar14 = (undefined4)((ulong)local_1c8.z >> 0x20);
      dVar15 = local_1c8.x;
    }
  }
  local_218 = loc.x;
  local_210 = loc.y;
  local_208 = loc.z;
  out->a1 = local_200.x;
  out->b1 = local_200.y;
  out->c1 = local_200.z;
  out->a2 = (double)CONCAT44(local_238.x._4_4_,local_238.x._0_4_);
  out->b2 = (double)CONCAT44(local_238.y._4_4_,local_238.y._0_4_);
  out->c2 = local_238.z;
  out->a3 = dVar15;
  out->b3 = (double)CONCAT44(uVar12,uVar11);
  out->c3 = (double)CONCAT44(uVar14,uVar13);
  pIVar4 = STEP::Object::
           ToPtr<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>
                     ((Object *)
                      ((long)&(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                              .
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar4 == (IfcCartesianTransformationOperator3DnonUniform *)0x0) {
    if ((op->Scale).have == true) {
      pdVar5 = STEP::Maybe<double>::Get(&op->Scale);
      uVar11 = SUB84(*pdVar5,0);
      uVar12 = (undefined4)((ulong)*pdVar5 >> 0x20);
    }
    else {
      uVar11 = 0;
      uVar12 = 0x3ff00000;
    }
    local_a8.b2 = (double)CONCAT44(uVar12,uVar11);
    local_a8.c3 = (double)CONCAT44(uVar12,uVar11);
  }
  else {
    uVar11 = 0;
    uVar12 = 0x3ff00000;
    if ((pIVar4->super_IfcCartesianTransformationOperator3D).
        super_IfcCartesianTransformationOperator.Scale.have == true) {
      pdVar5 = STEP::Maybe<double>::Get(&op->Scale);
      uVar11 = SUB84(*pdVar5,0);
      uVar12 = (undefined4)((ulong)*pdVar5 >> 0x20);
    }
    local_a8.b2 = 1.0;
    if (pIVar4->field_0xa0 == '\x01') {
      pdVar5 = STEP::Maybe<double>::Get
                         ((Maybe<double> *)
                          &(pIVar4->super_IfcCartesianTransformationOperator3D).field_0x98);
      local_a8.b2 = *pdVar5;
    }
    local_a8.c3 = 1.0;
    if ((pIVar4->Scale3).have == true) {
      local_220 = local_a8.b2;
      pdVar5 = STEP::Maybe<double>::Get(&pIVar4->Scale3);
      local_a8.c3 = *pdVar5;
      local_a8.b2 = local_220;
    }
  }
  local_a8.a4 = 0.0;
  local_a8.b1 = 0.0;
  local_a8.a2 = 0.0;
  local_a8.a3 = 0.0;
  local_a8.b3 = 0.0;
  local_a8.b4 = 0.0;
  local_a8.c1 = 0.0;
  local_a8.c2 = 0.0;
  local_a8.c4 = 0.0;
  local_a8.d1 = 0.0;
  local_a8.d2 = 0.0;
  local_a8.d3 = 0.0;
  local_a8.d4 = 1.0;
  local_a8.a1 = (double)CONCAT44(uVar12,uVar11);
  temp.a1 = 1.0;
  temp.a2 = 0.0;
  temp.a3 = 0.0;
  temp.a4 = local_218;
  temp.b1._0_4_ = 0;
  temp.b1._4_4_ = 0;
  temp.b2._0_4_ = 0;
  temp.b2._4_4_ = 0x3ff00000;
  temp.b3 = 0.0;
  temp.b4 = local_210;
  temp.c1 = 0.0;
  temp.c2 = 0.0;
  temp.c3 = 1.0;
  temp.c4 = local_208;
  temp.d1 = 0.0;
  temp.d2 = 0.0;
  temp.d3 = 0.0;
  temp.d4 = 1.0;
  aiMatrix4x4t<double>::operator*=(&temp,out);
  lVar7 = 0x10;
  paVar8 = &temp;
  paVar9 = &temp_1;
  for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
    paVar9->a1 = paVar8->a1;
    paVar8 = (aiMatrix4x4t<double> *)((long)paVar8 + (ulong)bVar10 * -0x10 + 8);
    paVar9 = (aiMatrix4x4t<double> *)((long)paVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  aiMatrix4x4t<double>::operator*=(&temp_1,&local_a8);
  paVar8 = &temp_1;
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    out->a1 = paVar8->a1;
    paVar8 = (aiMatrix4x4t<double> *)((long)paVar8 + (ulong)bVar10 * -0x10 + 8);
    out = (IfcMatrix4 *)((long)out + (ulong)bVar10 * -0x10 + 8);
  }
  return;
}

Assistant:

void ConvertTransformOperator(IfcMatrix4& out, const Schema_2x3::IfcCartesianTransformationOperator& op)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,op.LocalOrigin);

    IfcVector3 x(1.f,0.f,0.f),y(0.f,1.f,0.f),z(0.f,0.f,1.f);
    if (op.Axis1) {
        ConvertDirection(x,*op.Axis1.Get());
    }
    if (op.Axis2) {
        ConvertDirection(y,*op.Axis2.Get());
    }
    if (const Schema_2x3::IfcCartesianTransformationOperator3D* op2 = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3D>()) {
        if(op2->Axis3) {
            ConvertDirection(z,*op2->Axis3.Get());
        }
    }

    IfcMatrix4 locm;
    IfcMatrix4::Translation(loc,locm);
    AssignMatrixAxes(out,x,y,z);


    IfcVector3 vscale;
    if (const Schema_2x3::IfcCartesianTransformationOperator3DnonUniform* nuni = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>()) {
        vscale.x = nuni->Scale?op.Scale.Get():1.f;
        vscale.y = nuni->Scale2?nuni->Scale2.Get():1.f;
        vscale.z = nuni->Scale3?nuni->Scale3.Get():1.f;
    }
    else {
        const IfcFloat sc = op.Scale?op.Scale.Get():1.f;
        vscale = IfcVector3(sc,sc,sc);
    }

    IfcMatrix4 s;
    IfcMatrix4::Scaling(vscale,s);

    out = locm * out * s;
}